

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

char * get_BYTECODE_const_array_varname(Context *ctx,int base,int size)

{
  char *pcVar1;
  char buf [64];
  
  snprintf(buf,0x40,"c_array_%d_%d",base,(ulong)(uint)size);
  pcVar1 = StrDup(ctx,buf);
  return pcVar1;
}

Assistant:

static const char *get_BYTECODE_const_array_varname(Context *ctx, int base, int size)
{
    char buf[64];
    snprintf(buf, sizeof (buf), "c_array_%d_%d", base, size);
    return StrDup(ctx, buf);
}